

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O0

void get_minimap_dimensions(term_conflict *t,chunk *c,wchar_t tw,wchar_t th,int *mw,int *mh)

{
  wchar_t local_4c;
  wchar_t local_48;
  wchar_t local_40;
  wchar_t remainder;
  wchar_t cave_width;
  wchar_t cave_height;
  wchar_t map_width;
  wchar_t map_height;
  int *mh_local;
  int *mw_local;
  wchar_t th_local;
  wchar_t tw_local;
  chunk *c_local;
  term_conflict *t_local;
  
  cave_height = t->hgt + L'\xfffffffe';
  cave_width = t->wid + L'\xfffffffe';
  remainder = c->height;
  local_40 = c->width;
  if (L'\x01' < th) {
    if (0 < remainder % th) {
      remainder = (th - remainder % th) + remainder;
    }
    cave_height = cave_height - cave_height % th;
  }
  if (L'\x01' < tw) {
    if (0 < local_40 % tw) {
      local_40 = (tw - local_40 % tw) + local_40;
    }
    cave_width = cave_width - cave_width % tw;
  }
  if (remainder < cave_height) {
    local_48 = remainder;
  }
  else {
    local_48 = cave_height;
  }
  *mh = local_48;
  if (local_40 < cave_width) {
    local_4c = local_40;
  }
  else {
    local_4c = cave_width;
  }
  *mw = local_4c;
  return;
}

Assistant:

static void get_minimap_dimensions(term *t, const struct chunk *c,
	int tw, int th, int *mw, int *mh)
{
	int map_height = t->hgt - 2;
	int map_width = t->wid - 2;
	int cave_height = c->height;
	int cave_width = c->width;
	int remainder;

	if (th > 1) {
		/*
		 * Round cave height up to a multiple of the tile height
		 * (ideally want no information truncated).
		 */
		remainder = cave_height % th;
		if (remainder > 0) {
			cave_height += th - remainder;
		}

		/*
		 * Round map height down to a multiple of the tile height
		 * (don't want partial tiles overwriting the map borders).
		 */
		map_height -= map_height % th;
	}
	if (tw > 1) {
		/* As above but for the width. */
		remainder = cave_width % tw;
		if (remainder > 0) {
			cave_width += tw - remainder;
		}
		map_width -= map_width % tw;
	}

	*mh = MIN(map_height, cave_height);
	*mw = MIN(map_width, cave_width);
}